

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O3

void __thiscall CuToUtf8_All_Test::~CuToUtf8_All_Test(CuToUtf8_All_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (CuToUtf8, All) {
    using namespace pstore::utf;

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0001), utf8_string ({0x01}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0024), utf8_string ({0x24}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x00A2), utf8_string ({0xC2, 0xA2}));

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x007F), utf8_string ({0x7F}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0080), utf8_string ({0b11000010, 0x80}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x07FF), utf8_string ({0b11011111, 0xBF}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x0800), utf8_string ({0xE0, 0xA0, 0x80}));

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xD7FF), utf8_string ({0xED, 0x9F, 0xBF}));

    // Since RFC 3629 (November 2003), the high and low surrogate halves used by UTF-16 (U+D800
    // through U+DFFF) and code points not
    // encodable by UTF-16 (those after U+10FFFF) are not legal Unicode values
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xD800), utf8_string ({0xEF, 0xBF, 0xBD}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xDFFF), utf8_string ({0xEF, 0xBF, 0xBD}));

    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xE000), utf8_string ({0xEE, 0x80, 0x80}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0xFFFF), utf8_string ({0xEF, 0xBF, 0xBF}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x10000), utf8_string ({0xF0, 0x90, 0x80, 0x80}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x10FFFF), utf8_string ({0xF4, 0x8F, 0xBF, 0xBF}));
    EXPECT_EQ (code_point_to_utf8<utf8_string> (0x110000), utf8_string ({0xEF, 0xBF, 0xBD}));
}